

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_Active_Test::TestBody(InterpreterTestSuite_PC_Active_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FunctionMocker<bool_()> *this_00;
  string *this_01;
  string *this_02;
  undefined8 uVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Registry *this_03;
  bool bVar5;
  TypedExpectation<bool_()> *pTVar6;
  ActionInterface<bool_()> *pAVar7;
  CommissionerAppMock *this_04;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_05;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_06;
  _func_int **message;
  pointer *__ptr;
  char *expected_predicate_value;
  initializer_list<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>
  __l;
  undefined1 local_508 [16];
  undefined1 local_4f8 [31];
  Status local_4d9;
  undefined1 local_4d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  string local_4b8;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  undefined **local_478;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  CommissionerAppMockPtr pcaMock;
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [24];
  string local_400;
  Value value;
  ByteArray local_398;
  Matcher<const_ot::commissioner::Config_&> local_378;
  State local_358;
  State local_354;
  testing local_350;
  undefined7 uStack_34f;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_348;
  _func_int **local_340;
  undefined1 local_338 [8];
  undefined **ppuStack_330;
  undefined1 local_328 [8];
  undefined1 local_320 [16];
  _Alloc_hider local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_308;
  element_type local_300 [2];
  _Alloc_hider local_2f0;
  UnixTime local_1c0;
  UnixTime local_1b8;
  Error local_1b0;
  Error local_188;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  this_03 = ctx.mRegistry;
  value.mError._0_8_ = &value.mError.mMessage._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.1","");
  local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
       (_func_int **)0x0;
  local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
  local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_498._0_8_ = &local_488;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_354,0,0,0,0,0);
  local_508._0_8_ = local_4f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"net1","");
  local_4d8._0_8_ = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"");
  local_448._0_8_ = local_438;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"");
  local_428._0_8_ = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"");
  local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"domain1","");
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  message = (_func_int **)0x2ff875;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"","");
  ot::commissioner::UnixTime::UnixTime(&local_1b8,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_338,(string *)&value,0x4e21,(ByteArray *)&local_378,
             (string *)local_498,local_354,(string *)local_508,1,(string *)local_4d8,
             (string *)local_448,(Timestamp)0x0,0,(string *)local_428,&local_398,&local_4b8,'\0',0,
             &local_400,local_1b8,0x103f);
  local_350 = (testing)ot::commissioner::persistent_storage::Registry::Add
                                 (this_03,(BorderAgent *)local_338);
  local_4d9 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&pcaMock,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",(Status *)&local_350,&local_4d9);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_338);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  if (local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_428._0_8_ != local_418) {
    operator_delete((void *)local_428._0_8_);
  }
  if ((undefined1 *)local_448._0_8_ != local_438) {
    operator_delete((void *)local_448._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_);
  }
  if ((undefined1 *)local_508._0_8_ != local_4f8) {
    operator_delete((void *)local_508._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._0_8_ != &local_488) {
    operator_delete((void *)local_498._0_8_);
  }
  if (local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
      (_func_int **)0x0) {
    operator_delete(local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase)
    ;
  }
  if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
    operator_delete((void *)value.mError._0_8_);
  }
  _Var4._M_pi = pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if ((char)pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)local_338);
    if (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      message = (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x480,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (local_338 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_338 + 8))();
    }
    if (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00169b08;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base !=
        pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1) {
      operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base);
    }
  }
  else {
    if (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_vptr__Sp_counted_base !=
          pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1) {
        operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_vptr__Sp_counted_base);
      }
      operator_delete(_Var4._M_pi);
    }
    value.mError._0_8_ = &value.mError.mMessage._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value,"127.0.0.2","");
    local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
         (_func_int **)0x0;
    local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (MatcherInterface<const_ot::commissioner::Config_&> *)0x0;
    local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_498._0_8_ = &local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_358,0,0,0,0,0);
    local_508._0_8_ = local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"net2","");
    local_4d8._0_8_ = &local_4c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"");
    local_448._0_8_ = local_438;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"");
    local_428._0_8_ = local_418;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"");
    local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"domain1","");
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    local_340 = (_func_int **)0x2ff875;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400);
    ot::commissioner::UnixTime::UnixTime(&local_1c0,0);
    expected_predicate_value = (char *)(ulong)(uint)local_358;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)local_338,(string *)&value,0x4e21,(ByteArray *)&local_378,
               (string *)local_498,local_358,(string *)local_508,2,(string *)local_4d8,
               (string *)local_448,(Timestamp)0x0,0,(string *)local_428,&local_398,&local_4b8,'\0',0
               ,&local_400,local_1c0,0x103f);
    local_350 = (testing)ot::commissioner::persistent_storage::Registry::Add
                                   (ctx.mRegistry,(BorderAgent *)local_338);
    local_4d9 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&pcaMock,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",(Status *)&local_350,&local_4d9);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p);
    }
    if (local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((undefined1 *)local_428._0_8_ != local_418) {
      operator_delete((void *)local_428._0_8_);
    }
    if ((undefined1 *)local_448._0_8_ != local_438) {
      operator_delete((void *)local_448._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_);
    }
    if ((undefined1 *)local_508._0_8_ != local_4f8) {
      operator_delete((void *)local_508._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_);
    }
    if (local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase !=
        (_func_int **)0x0) {
      operator_delete(local_378.super_MatcherBase<const_ot::commissioner::Config_&>.
                      _vptr_MatcherBase);
    }
    if ((size_type *)value.mError._0_8_ != &value.mError.mMessage._M_string_length) {
      operator_delete((void *)value.mError._0_8_);
    }
    _Var4._M_pi = pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if ((char)pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        '\0') {
      if (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_vptr__Sp_counted_base !=
            pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi + 1) {
          operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          (pcaMock.
                           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_vptr__Sp_counted_base);
        }
        operator_delete(_Var4._M_pi);
      }
      testing::internal::UntypedFunctionMockerBase::RegisterOwner
                (&((ctx.mDefaultCommissionerObject.
                    super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  gmock10_IsActive_81).super_UntypedFunctionMockerBase,
                 ctx.mDefaultCommissionerObject.
                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      local_498._0_8_ =
           &(ctx.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            gmock10_IsActive_81;
      testing::internal::GetWithoutMatchers();
      pTVar6 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                         ((MockSpec<bool_()> *)local_498,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x487,"*ctx.mDefaultCommissionerObject","IsActive()");
      pTVar6 = testing::internal::TypedExpectation<bool_()>::Times(pTVar6,2);
      local_508._0_8_ = operator_new(1);
      *(bool *)local_508._0_8_ = false;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_508 + 8),
                 (bool *)local_508._0_8_);
      pAVar7 = (ActionInterface<bool_()> *)operator_new(0x10);
      pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b808;
      bVar5 = *(bool *)local_508._0_8_;
      *(bool *)&pAVar7[1]._vptr_ActionInterface = bVar5;
      *(bool *)((long)&pAVar7[1]._vptr_ActionInterface + 1) = bVar5;
      testing::Action<bool_()>::Action((Action<bool_()> *)local_338,pAVar7);
      pTVar6 = testing::internal::TypedExpectation<bool_()>::WillOnce
                         (pTVar6,(Action<bool_()> *)local_338);
      local_4d8._0_8_ = operator_new(1);
      *(bool *)local_4d8._0_8_ = true;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_4d8 + 8),
                 (bool *)local_4d8._0_8_);
      pAVar7 = (ActionInterface<bool_()> *)operator_new(0x10);
      pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b808;
      bVar5 = *(bool *)local_4d8._0_8_;
      *(bool *)&pAVar7[1]._vptr_ActionInterface = bVar5;
      *(bool *)((long)&pAVar7[1]._vptr_ActionInterface + 1) = bVar5;
      testing::Action<bool_()>::Action((Action<bool_()> *)&value,pAVar7);
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar6,(Action<bool_()> *)&value);
      if (value.mError.mMessage._M_string_length != 0) {
        (*(code *)value.mError.mMessage._M_string_length)(&value,&value,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_4d8._12_4_,local_4d8._8_4_)
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
      }
      if (local_328 != (undefined1  [8])0x0) {
        (*(code *)local_328)(local_338,local_338,3);
      }
      if ((pointer)local_508._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
      }
      local_4b8.field_2._M_allocated_capacity = 0;
      local_4b8._M_dataplus._M_p = (pointer)0x0;
      local_4b8._M_string_length = 0;
      value.mError.mMessage._M_dataplus._M_p = (pointer)&value.mError.mMessage.field_2;
      value.mError._0_8_ = value.mError._0_8_ & 0xffffffff00000000;
      value.mError.mMessage._M_string_length = 0;
      value.mError.mMessage.field_2._M_local_buf[0] = '\0';
      value.mData._M_dataplus._M_p = (pointer)&value.mData.field_2;
      value.mData._M_string_length = 0;
      value.mData.field_2._M_local_buf[0] = '\0';
      local_338 = (undefined1  [8])local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"active","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)local_508,&ctx.mInterpreter,(string *)local_338);
      local_488._M_allocated_capacity = local_4b8.field_2._M_allocated_capacity;
      local_498._8_8_ = local_4b8._M_string_length;
      local_498._0_8_ = local_4b8._M_dataplus._M_p;
      local_4b8.field_2._M_allocated_capacity = local_4f8._0_8_;
      local_4b8._M_dataplus._M_p = (pointer)local_508._0_8_;
      local_4b8._M_string_length = local_508._8_8_;
      local_508._0_8_ = (long *)0x0;
      local_508._8_8_ = (pointer)0x0;
      local_4f8._0_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_508);
      if (local_338 != (undefined1  [8])local_328) {
        operator_delete((void *)local_338);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_338,&ctx.mInterpreter,(Expression *)&local_4b8);
      value.mError.mCode = local_338._0_4_;
      std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&ppuStack_330);
      std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_310);
      if ((element_type *)local_310._M_p != local_300) {
        operator_delete(local_310._M_p);
      }
      if (ppuStack_330 != (undefined **)local_320) {
        operator_delete(ppuStack_330);
      }
      bVar5 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      local_498[0] = bVar5;
      local_498._8_8_ = (pointer)0x0;
      if (!bVar5) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_338,(internal *)local_498,(AssertionResult *)0x2ddeee,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x48e,(char *)local_338);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338);
        }
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
        uVar2 = local_498._8_8_;
        if ((pointer)local_498._8_8_ != (pointer)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined8 **)local_498._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_498._8_8_);
          }
          operator_delete((void *)uVar2);
        }
      }
      local_338 = (undefined1  [8])local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"active","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)local_508,&ctx.mInterpreter,(string *)local_338);
      local_488._M_allocated_capacity = local_4b8.field_2._M_allocated_capacity;
      local_498._8_8_ = local_4b8._M_string_length;
      local_498._0_8_ = local_4b8._M_dataplus._M_p;
      local_4b8.field_2._M_allocated_capacity = local_4f8._0_8_;
      local_4b8._M_dataplus._M_p = (pointer)local_508._0_8_;
      local_4b8._M_string_length = local_508._8_8_;
      local_508._0_8_ = (long *)0x0;
      local_508._8_8_ = (pointer)0x0;
      local_4f8._0_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_508);
      if (local_338 != (undefined1  [8])local_328) {
        operator_delete((void *)local_338);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_338,&ctx.mInterpreter,(Expression *)&local_4b8);
      value.mError.mCode = local_338._0_4_;
      std::__cxx11::string::operator=((string *)&value.mError.mMessage,(string *)&ppuStack_330);
      std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_310);
      if ((element_type *)local_310._M_p != local_300) {
        operator_delete(local_310._M_p);
      }
      if (ppuStack_330 != (undefined **)local_320) {
        operator_delete(ppuStack_330);
      }
      bVar5 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      local_498[0] = bVar5;
      local_498._8_8_ = (pointer)0x0;
      if (!bVar5) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_338,(internal *)local_498,(AssertionResult *)0x2ddeee,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x493,(char *)local_338);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338);
        }
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
        uVar2 = local_498._8_8_;
        if ((pointer)local_498._8_8_ != (pointer)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined8 **)local_498._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_498._8_8_);
          }
          operator_delete((void *)uVar2);
        }
      }
      this_04 = (CommissionerAppMock *)operator_new(0x1838);
      memset(this_04,0,0x1838);
      CommissionerAppMock::CommissionerAppMock(this_04);
      pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_04;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<CommissionerAppMock*>
                (&pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_04);
      local_400._M_string_length = (size_type)operator_new(8);
      ((MatcherDescriberInterface *)
      &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400._M_string_length)->
       _vptr__Sp_counted_base)->_vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_0039a928;
      local_400._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>&>const*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_400.field_2._M_allocated_capacity,
                 (MatcherInterface<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)
                 local_400._M_string_length);
      local_400._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395cd8;
      local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)operator_new(8);
      ((local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherDescriberInterface_0039a9e0;
      local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
           (_func_int **)&PTR__MatcherBase_00395d88;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<testing::MatcherInterface<ot::commissioner::Config_const&>const*>
                (&local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                  super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
           (_func_int **)&PTR__MatcherBase_00395d40;
      CommissionerAppStaticExpecter::gmock_Create
                ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)local_498,&ctx.mCommissionerAppStaticExpecter,
                 (Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> *)&local_400,
                 &local_378);
      testing::internal::GetWithoutMatchers();
      this_05 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                ::InternalExpectedAt
                          ((MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                            *)local_498,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x496,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
      paVar1 = &local_188.mMessage.field_2;
      local_188.mCode = kNone;
      local_188.mMessage._M_string_length = 0;
      local_188.mMessage.field_2._M_local_buf[0] = '\0';
      local_188.mMessage._M_dataplus._M_p = (pointer)paVar1;
      testing::Return<ot::commissioner::Error>(&local_350,&local_188);
      local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT71(uStack_34f,local_350);
      local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_348;
      if (local_348 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_348->_M_use_count = local_348->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_348->_M_use_count = local_348->_M_use_count + 1;
        }
      }
      local_508._8_8_ = (pointer)0x0;
      local_4f8._0_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1175:36)>
           ::_M_manager;
      local_4f8._8_8_ =
           std::
           _Function_handler<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1175:36)>
           ::_M_invoke;
      local_508._0_8_ = (internal *)&pcaMock;
      local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&pcaMock;
      std::function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::function
                ((function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)local_4d8,
                 (function<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)local_508)
      ;
      local_438._0_8_ = 0;
      local_438._8_8_ = 0;
      local_448._0_8_ = (pointer)0x0;
      local_448._8_8_ = 0;
      local_448._0_8_ = operator_new(0x20);
      *(undefined8 *)local_448._0_8_ = 0;
      *(undefined8 *)(local_448._0_8_ + 8) = 0;
      *(undefined8 *)(local_448._0_8_ + 0x10) = 0;
      *(undefined8 *)(local_448._0_8_ + 0x18) = local_4c8._8_8_;
      if (local_4c8._M_allocated_capacity != 0) {
        *(undefined4 *)local_448._0_8_ = local_4d8._0_4_;
        *(undefined4 *)(local_448._0_8_ + 4) = local_4d8._4_4_;
        *(undefined4 *)(local_448._0_8_ + 8) = local_4d8._8_4_;
        *(undefined4 *)(local_448._0_8_ + 0xc) = local_4d8._12_4_;
        *(size_type *)(local_448._0_8_ + 0x10) = local_4c8._M_allocated_capacity;
      }
      local_448._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_438._0_8_ = std::_Function_handler::operator_cast_to_Action;
      local_438._8_8_ = std::_Function_handler::operator_cast_to_Action;
      if ((code *)local_4f8._0_8_ != (code *)0x0) {
        (*(code *)local_4f8._0_8_)(local_508,local_508,3);
      }
      __l._M_len = 1;
      __l._M_array = (iterator)local_448;
      std::
      vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
      ::vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                *)local_338,__l,(allocator_type *)local_508);
      if ((code *)local_438._0_8_ != (code *)0x0) {
        (*(code *)local_438._0_8_)(local_448,local_448,3);
      }
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                  *)local_320,(ReturnAction *)&local_398);
      local_418._0_8_ = 0;
      local_418._8_8_ = 0;
      local_428._0_8_ = (pointer)0x0;
      local_428._8_8_ = 0;
      local_428._0_8_ = operator_new(0x38);
      *(undefined1 (*) [8])local_428._0_8_ = local_338;
      *(undefined ***)(local_428._0_8_ + 8) = ppuStack_330;
      *(undefined1 (*) [8])(local_428._0_8_ + 0x10) = local_328;
      local_328 = (undefined1  [8])0x0;
      local_338 = (undefined1  [8])0x0;
      ppuStack_330 = (undefined **)0x0;
      *(undefined8 *)(local_428._0_8_ + 0x28) = 0;
      *(undefined8 *)(local_428._0_8_ + 0x18) = 0;
      *(undefined8 *)(local_428._0_8_ + 0x20) = 0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_428._0_8_ + 0x30) = _Stack_308._M_pi;
      if ((element_type *)local_310._M_p != (element_type *)0x0) {
        *(undefined8 *)(local_428._0_8_ + 0x18) = local_320._0_8_;
        *(undefined8 *)(local_428._0_8_ + 0x20) = local_320._8_8_;
        *(pointer *)(local_428._0_8_ + 0x28) = local_310._M_p;
        local_310._M_p = (pointer)0x0;
        _Stack_308._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      local_428._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_418._0_8_ = std::_Function_handler::operator_cast_to_Action;
      local_418._8_8_ = std::_Function_handler::operator_cast_to_Action;
      std::
      vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
      ::~vector((vector<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>,_std::allocator<testing::Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>_>_>
                 *)local_338);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
      ::WillOnce(this_05,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_428);
      if ((code *)local_418._0_8_ != (code *)0x0) {
        (*(code *)local_418._0_8_)(local_428,local_428,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_398.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_348 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_348);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.mMessage._M_dataplus._M_p != paVar1) {
        operator_delete(local_188.mMessage._M_dataplus._M_p);
      }
      local_478 = &PTR__MatcherBase_00395d20;
      if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
      }
      local_498._8_8_ = &PTR__MatcherBase_00395d88;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_488._8_8_);
      }
      local_378.super_MatcherBase<const_ot::commissioner::Config_&>._vptr_MatcherBase =
           (_func_int **)&PTR__MatcherBase_00395d88;
      if (local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
          super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_378.super_MatcherBase<const_ot::commissioner::Config_&>.impl_.
                   super___shared_ptr<const_testing::MatcherInterface<const_ot::commissioner::Config_&>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      local_400._M_dataplus._M_p = (pointer)&PTR__MatcherBase_00395d20;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400.field_2._M_allocated_capacity !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_400.field_2._M_allocated_capacity);
      }
      peVar3 = pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      testing::internal::GetWithoutMatchers();
      CommissionerAppMock::gmock_Start
                ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_338,peVar3,(WithoutMatchers *)local_4d8,
                 (Function<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)0x0);
      this_06 = testing::internal::
                MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                ::InternalExpectedAt
                          ((MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                            *)local_338,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                           ,0x498,"*pcaMock","Start");
      paVar1 = &local_1b0.mMessage.field_2;
      local_1b0.mCode = kNone;
      local_1b0.mMessage._M_string_length = 0;
      local_1b0.mMessage.field_2._M_local_buf[0] = '\0';
      local_1b0.mMessage._M_dataplus._M_p = (pointer)paVar1;
      testing::Return<ot::commissioner::Error>((testing *)local_508,&local_1b0);
      testing::internal::ReturnAction::operator_cast_to_Action
                ((Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                  *)local_498,(ReturnAction *)local_508);
      testing::internal::
      TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
      ::WillOnce(this_06,(Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                          *)local_498);
      if ((code *)local_488._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_488._M_allocated_capacity)(local_498,local_498,3);
      }
      if ((pointer)local_508._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_508._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0.mMessage._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b0.mMessage._M_dataplus._M_p);
      }
      local_300[0].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (MatcherDescriberInterface)&PTR__MatcherBase_00396e08;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._M_p);
      }
      local_320._8_8_ = &PTR__MatcherBase_003968b0;
      if (_Stack_308._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_308._M_pi);
      }
      ppuStack_330 = &PTR__MatcherBase_00396a78;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._0_8_);
      }
      peVar3 = pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      testing::internal::GetWithoutMatchers();
      this_00 = &peVar3->gmock10_IsActive_81;
      testing::internal::UntypedFunctionMockerBase::RegisterOwner
                (&this_00->super_UntypedFunctionMockerBase,peVar3);
      local_4d8._0_8_ = this_00;
      pTVar6 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                         ((MockSpec<bool_()> *)local_4d8,
                          "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                          ,0x499,"*pcaMock","IsActive");
      pTVar6 = testing::internal::TypedExpectation<bool_()>::Times(pTVar6,3);
      local_448._0_8_ = operator_new(1);
      *(bool *)local_448._0_8_ = false;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_448 + 8),
                 (bool *)local_448._0_8_);
      pAVar7 = (ActionInterface<bool_()> *)operator_new(0x10);
      this_01 = &value.mData;
      this_02 = &value.mError.mMessage;
      pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b808;
      bVar5 = *(bool *)local_448._0_8_;
      *(bool *)&pAVar7[1]._vptr_ActionInterface = bVar5;
      *(bool *)((long)&pAVar7[1]._vptr_ActionInterface + 1) = bVar5;
      testing::Action<bool_()>::Action((Action<bool_()> *)local_338,pAVar7);
      pTVar6 = testing::internal::TypedExpectation<bool_()>::WillOnce
                         (pTVar6,(Action<bool_()> *)local_338);
      local_428._0_8_ = operator_new(1);
      *(bool *)local_428._0_8_ = true;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8),
                 (bool *)local_428._0_8_);
      pAVar7 = (ActionInterface<bool_()> *)operator_new(0x10);
      pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b808;
      bVar5 = *(bool *)local_428._0_8_;
      *(bool *)&pAVar7[1]._vptr_ActionInterface = bVar5;
      *(bool *)((long)&pAVar7[1]._vptr_ActionInterface + 1) = bVar5;
      testing::Action<bool_()>::Action((Action<bool_()> *)local_498,pAVar7);
      pTVar6 = testing::internal::TypedExpectation<bool_()>::WillOnce
                         (pTVar6,(Action<bool_()> *)local_498);
      local_400._M_dataplus._M_p = (pointer)operator_new(1);
      *local_400._M_dataplus._M_p = false;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bool*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_400._M_string_length,
                 (bool *)local_400._M_dataplus._M_p);
      pAVar7 = (ActionInterface<bool_()> *)operator_new(0x10);
      pAVar7->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0039b808;
      bVar5 = (bool)*local_400._M_dataplus._M_p;
      *(bool *)&pAVar7[1]._vptr_ActionInterface = bVar5;
      *(bool *)((long)&pAVar7[1]._vptr_ActionInterface + 1) = bVar5;
      testing::Action<bool_()>::Action((Action<bool_()> *)local_508,pAVar7);
      testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar6,(Action<bool_()> *)local_508);
      if ((code *)local_4f8._0_8_ != (code *)0x0) {
        (*(code *)local_4f8._0_8_)(local_508,local_508,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_400._M_string_length);
      }
      if ((code *)local_488._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_488._M_allocated_capacity)(local_498,local_498,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_428._8_8_);
      }
      if (local_328 != (undefined1  [8])0x0) {
        (*(code *)local_328)(local_338,local_338,3);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._8_8_);
      }
      local_338 = (undefined1  [8])local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"start --nwk net1","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)local_508,&ctx.mInterpreter,(string *)local_338);
      local_488._M_allocated_capacity = local_4b8.field_2._M_allocated_capacity;
      local_498._8_8_ = local_4b8._M_string_length;
      local_498._0_8_ = local_4b8._M_dataplus._M_p;
      local_4b8.field_2._M_allocated_capacity = local_4f8._0_8_;
      local_4b8._M_dataplus._M_p = (pointer)local_508._0_8_;
      local_4b8._M_string_length = local_508._8_8_;
      local_508._0_8_ = (long *)0x0;
      local_508._8_8_ = (pointer)0x0;
      local_4f8._0_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_508);
      if (local_338 != (undefined1  [8])local_328) {
        operator_delete((void *)local_338);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_338,&ctx.mInterpreter,(Expression *)&local_4b8);
      value.mError.mCode = local_338._0_4_;
      std::__cxx11::string::operator=((string *)this_02,(string *)&ppuStack_330);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_310);
      if ((element_type *)local_310._M_p != local_300) {
        operator_delete(local_310._M_p);
      }
      if (ppuStack_330 != (undefined **)local_320) {
        operator_delete(ppuStack_330);
      }
      bVar5 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      local_498[0] = bVar5;
      local_498._8_8_ = (pointer)0x0;
      if (!bVar5) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_338,(internal *)local_498,(AssertionResult *)0x2ddeee,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x49c,(char *)local_338);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338);
        }
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
        uVar2 = local_498._8_8_;
        if ((pointer)local_498._8_8_ != (pointer)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined8 **)local_498._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_498._8_8_);
          }
          operator_delete((void *)uVar2);
        }
      }
      local_338 = (undefined1  [8])local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"active --nwk net1","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)local_508,&ctx.mInterpreter,(string *)local_338);
      local_488._M_allocated_capacity = local_4b8.field_2._M_allocated_capacity;
      local_498._8_8_ = local_4b8._M_string_length;
      local_498._0_8_ = local_4b8._M_dataplus._M_p;
      local_4b8.field_2._M_allocated_capacity = local_4f8._0_8_;
      local_4b8._M_dataplus._M_p = (pointer)local_508._0_8_;
      local_4b8._M_string_length = local_508._8_8_;
      local_508._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_508._8_8_ = (pointer)0x0;
      local_4f8._0_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_508);
      if (local_338 != (undefined1  [8])local_328) {
        operator_delete((void *)local_338);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_338,&ctx.mInterpreter,(Expression *)&local_4b8);
      value.mError.mCode = local_338._0_4_;
      std::__cxx11::string::operator=((string *)this_02,(string *)&ppuStack_330);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_310);
      if ((element_type *)local_310._M_p != local_300) {
        operator_delete(local_310._M_p);
      }
      if (ppuStack_330 != (undefined **)local_320) {
        operator_delete(ppuStack_330);
      }
      bVar5 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      local_498[0] = bVar5;
      local_498._8_8_ = (pointer)0x0;
      if (!bVar5) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_338,(internal *)local_498,(AssertionResult *)0x2ddeee,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x4a0,(char *)local_338);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_508._0_8_ + 8))();
        }
        uVar2 = local_498._8_8_;
        if ((pointer)local_498._8_8_ != (pointer)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined8 **)local_498._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_498._8_8_);
          }
          operator_delete((void *)uVar2);
        }
      }
      local_338 = (undefined1  [8])local_328;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"active --nwk net1","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)local_508,&ctx.mInterpreter,(string *)local_338);
      local_488._M_allocated_capacity = local_4b8.field_2._M_allocated_capacity;
      local_498._8_8_ = local_4b8._M_string_length;
      local_498._0_8_ = local_4b8._M_dataplus._M_p;
      local_4b8.field_2._M_allocated_capacity = local_4f8._0_8_;
      local_4b8._M_dataplus._M_p = (pointer)local_508._0_8_;
      local_4b8._M_string_length = local_508._8_8_;
      local_508._0_8_ = (long *)0x0;
      local_508._8_8_ = (pointer)0x0;
      local_4f8._0_8_ = (code *)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_498);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_508);
      if (local_338 != (undefined1  [8])local_328) {
        operator_delete((void *)local_338);
      }
      ot::commissioner::Interpreter::Eval
                ((Value *)local_338,&ctx.mInterpreter,(Expression *)&local_4b8);
      value.mError.mCode = local_338._0_4_;
      std::__cxx11::string::operator=((string *)this_02,(string *)&ppuStack_330);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_310);
      if ((element_type *)local_310._M_p != local_300) {
        operator_delete(local_310._M_p);
      }
      if (ppuStack_330 != (undefined **)local_320) {
        operator_delete(ppuStack_330);
      }
      bVar5 = ot::commissioner::Interpreter::Value::HasNoError(&value);
      local_498[0] = bVar5;
      local_498._8_8_ = (pointer)0x0;
      if (!bVar5) {
        testing::Message::Message((Message *)local_508);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_338,(internal *)local_498,(AssertionResult *)0x2ddeee,"false",
                   "true",expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_4d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x4a4,(char *)local_338);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_508);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
        if (local_338 != (undefined1  [8])local_328) {
          operator_delete((void *)local_338);
        }
        if ((long *)local_508._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_508._0_8_ + 8))();
        }
        uVar2 = local_498._8_8_;
        if ((pointer)local_498._8_8_ != (pointer)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*(undefined8 **)local_498._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498._8_8_ + 0x10)) {
            operator_delete(*(undefined8 **)local_498._8_8_);
          }
          operator_delete((void *)uVar2);
        }
      }
      if (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value.mData._M_dataplus._M_p != &value.mData.field_2) {
        operator_delete(value.mData._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value.mError.mMessage._M_dataplus._M_p != &value.mError.mMessage.field_2) {
        operator_delete(value.mError.mMessage._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_4b8);
      goto LAB_00169b08;
    }
    testing::Message::Message((Message *)local_338);
    if (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_340 = (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&value,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x485,(char *)local_340);
    testing::internal::AssertHelper::operator=((AssertHelper *)&value,(Message *)local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&value);
    if (local_338 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)local_338 + 8))();
    }
    if (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00169b08;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base !=
        pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1) {
      operator_delete((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_vptr__Sp_counted_base);
    }
  }
  operator_delete(pcaMock.super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
LAB_00169b08:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Active)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, IsActive()).Times(2).WillOnce(Return(false)).WillOnce(Return(true));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    // TODO add result verification

    expr  = ctx.mInterpreter.ParseExpression("active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    CommissionerAppMockPtr pcaMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = pcaMock; }), Return(Error{})));
    EXPECT_CALL(*pcaMock, Start).WillOnce(Return(Error{}));
    EXPECT_CALL(*pcaMock, IsActive).Times(3).WillOnce(Return(false)).WillOnce(Return(true)).WillOnce(Return(false));
    expr  = ctx.mInterpreter.ParseExpression("start --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("active --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("active --nwk net1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}